

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

void __thiscall
CommandDrawInventoryBar::Tick
          (CommandDrawInventoryBar *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,
          bool hudChanged)

{
  int iVar1;
  int iVar2;
  CommandDrawNumber **ppCVar3;
  CommandDrawNumber *pCVar4;
  int iVar5;
  uint i;
  ulong uVar6;
  ulong uVar7;
  
  if (this->counters == (CommandDrawNumber **)0x0) {
    iVar1 = GetCounterSpacing(this,statusBar);
    uVar7 = (ulong)this->size;
    ppCVar3 = (CommandDrawNumber **)operator_new__(uVar7 << 3);
    this->counters = ppCVar3;
    iVar5 = 0;
    for (uVar6 = 0; uVar6 < uVar7; uVar6 = uVar6 + 1) {
      pCVar4 = (CommandDrawNumber *)operator_new(0xa0);
      CommandDrawNumber::CommandDrawNumber(pCVar4,(this->super_SBarInfoCommand).script);
      this->counters[uVar6] = pCVar4;
      iVar2 = iVar5;
      if (this->vertical != false) {
        iVar2 = 0;
      }
      (this->counters[uVar6]->super_CommandDrawString).startX =
           (SBarInfoCoordinate)(iVar2 + (int)this->counterX);
      iVar2 = 0;
      if (this->vertical != false) {
        iVar2 = iVar5;
      }
      (this->counters[uVar6]->super_CommandDrawString).y =
           (SBarInfoCoordinate)(iVar2 + (int)this->counterY);
      ppCVar3 = this->counters;
      pCVar4 = ppCVar3[uVar6];
      pCVar4->normalTranslation = this->translation;
      (pCVar4->super_CommandDrawString).font = this->font;
      pCVar4 = ppCVar3[uVar6];
      (pCVar4->super_CommandDrawString).spacing = this->fontSpacing;
      (pCVar4->super_CommandDrawString).field_0x5d = this->alwaysShowCounter ^ 1;
      pCVar4->value = CONSTANT;
      pCVar4->drawValue = 0x1c;
      pCVar4->length = 0x7fffffff;
      (pCVar4->super_CommandDrawString).shadow = this->shadow;
      iVar2 = this->shadowY;
      (pCVar4->super_CommandDrawString).shadowX = this->shadowX;
      (pCVar4->super_CommandDrawString).shadowY = iVar2;
      uVar7 = (ulong)this->size;
      iVar5 = iVar5 + iVar1 * 2;
    }
  }
  for (uVar6 = 0; uVar6 < this->size; uVar6 = uVar6 + 1) {
    (*(this->counters[uVar6]->super_CommandDrawString).super_SBarInfoCommand._vptr_SBarInfoCommand
      [5])(this->counters[uVar6],block,statusBar,hudChanged);
  }
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			// Make the counters if need be.
			if(counters == NULL)
			{
				int spacing = GetCounterSpacing(statusBar);

				counters = new CommandDrawNumber*[size];
		
				for(unsigned int i = 0;i < size;i++)
				{
					counters[i] = new CommandDrawNumber(script);
		
					counters[i]->startX = counterX + (!vertical ? spacing*i : 0);
					counters[i]->y = counterY + (vertical ? spacing*i : 0);
					counters[i]->normalTranslation = translation;
					counters[i]->font = font;
					counters[i]->spacing = fontSpacing;
					counters[i]->whenNotZero = !alwaysShowCounter;
					counters[i]->drawValue = counters[i]->value = CommandDrawNumber::CONSTANT;
					counters[i]->length = INT_MAX;
					counters[i]->shadow = shadow;
					counters[i]->shadowX = shadowX;
					counters[i]->shadowY = shadowY;
				}
			}
		
			for(unsigned int i = 0;i < size;i++)
				counters[i]->Tick(block, statusBar, hudChanged);
		}